

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *nonz,int rn)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  undefined8 uVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  bool bVar11;
  type_conflict5 tVar12;
  int *piVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  cpp_dec_float<50U,_int,_void> *v;
  int *piVar17;
  ulong uVar18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_278;
  int local_274;
  int *local_270;
  cpp_dec_float<50U,_int,_void> local_268;
  cpp_dec_float<50U,_int,_void> local_228;
  int local_1ec;
  int *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  cpp_dec_float<50U,_int,_void> local_1d8;
  int *local_1a0;
  int *local_198;
  int *local_190;
  pointer local_188;
  ulong local_180;
  int *local_178;
  int *local_170;
  cpp_dec_float<50U,_int,_void> local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_1d8.data._M_elems._32_5_ = 0;
  local_1d8.data._M_elems[9]._1_3_ = 0;
  local_1d8.exp = 0;
  local_1d8.neg = false;
  local_1d8.data._M_elems[4] = 0;
  local_1d8.data._M_elems[5] = 0;
  local_1d8.data._M_elems._24_5_ = 0;
  local_1d8.data._M_elems[7]._1_3_ = 0;
  local_1d8.data._M_elems[0] = 0;
  local_1d8.data._M_elems[1] = 0;
  local_1d8.data._M_elems[2] = 0;
  local_1d8.data._M_elems[3] = 0;
  local_1d8.prec_elem = 10;
  local_268.fpclass = cpp_dec_float_finite;
  local_268.prec_elem = 10;
  local_268.data._M_elems[0] = 0;
  local_268.data._M_elems[1] = 0;
  local_268.data._M_elems[2] = 0;
  local_268.data._M_elems[3] = 0;
  local_268.data._M_elems[4] = 0;
  local_268.data._M_elems[5] = 0;
  local_268.data._M_elems._24_5_ = 0;
  local_268.data._M_elems[7]._1_3_ = 0;
  local_268.data._M_elems._32_5_ = 0;
  local_268.data._M_elems[9]._1_3_ = 0;
  local_268.exp = 0;
  local_268.neg = false;
  local_188 = (this->l).rval.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_190 = (this->l).ridx;
  local_198 = (this->l).rbeg;
  piVar13 = (this->l).rorig;
  local_1e8 = (this->l).rperm;
  local_278 = 0;
  local_274 = rn;
  local_270 = nonz;
  local_1e0 = eps;
  while (local_278 < rn) {
    enQueueMax(local_270,&local_278,local_1e8[local_270[local_278]]);
  }
  uVar18 = 0;
  piVar17 = local_270 + this->thedim;
  local_1a0 = piVar13;
  while (0 < rn) {
    local_278 = deQueueMax(local_270,&local_274);
    iVar3 = piVar13[local_278];
    local_1d8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar3].m_backend.data._M_elems;
    local_1d8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 2);
    puVar2 = vec[iVar3].m_backend.data._M_elems + 4;
    local_1d8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    uVar6 = *(undefined8 *)(puVar2 + 2);
    local_1d8.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_1d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    uVar6 = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 8);
    local_1d8.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_1d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_1d8.exp = vec[iVar3].m_backend.exp;
    local_1d8.neg = vec[iVar3].m_backend.neg;
    local_1d8.fpclass = vec[iVar3].m_backend.fpclass;
    local_1d8.prec_elem = vec[iVar3].m_backend.prec_elem;
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)vec[iVar3].m_backend.data._M_elems;
    local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 2)
    ;
    puVar2 = vec[iVar3].m_backend.data._M_elems + 4;
    local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 8);
    local_68.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((local_1e0->m_backend).data._M_elems + 8);
    local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_1e0->m_backend).data._M_elems;
    local_68.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((local_1e0->m_backend).data._M_elems + 2);
    local_68.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((local_1e0->m_backend).data._M_elems + 4);
    local_68.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((local_1e0->m_backend).data._M_elems + 6);
    local_68.m_backend.exp = (local_1e0->m_backend).exp;
    local_68.m_backend.neg = (local_1e0->m_backend).neg;
    local_68.m_backend.fpclass = (local_1e0->m_backend).fpclass;
    local_68.m_backend.prec_elem = (local_1e0->m_backend).prec_elem;
    local_e8.m_backend.exp = local_1d8.exp;
    local_e8.m_backend.neg = local_1d8.neg;
    local_e8.m_backend.fpclass = local_1d8.fpclass;
    local_e8.m_backend.prec_elem = local_1d8.prec_elem;
    bVar11 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_e8,&local_68);
    if (bVar11) {
      piVar17[-1] = iVar3;
      local_178 = piVar17 + -1;
      iVar16 = local_198[iVar3];
      v = &local_188[iVar16].m_backend;
      piVar13 = local_190 + iVar16;
      iVar16 = local_198[(long)iVar3 + 1] - iVar16;
      local_180 = uVar18;
      while (0 < iVar16) {
        iVar3 = *piVar13;
        pnVar1 = vec + iVar3;
        uVar6 = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 8);
        local_268.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_268.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_268.data._M_elems._0_8_ = *(undefined8 *)vec[iVar3].m_backend.data._M_elems;
        local_268.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 2);
        puVar2 = vec[iVar3].m_backend.data._M_elems + 4;
        local_268.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        uVar6 = *(undefined8 *)(puVar2 + 2);
        local_268.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_268.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_268.exp = vec[iVar3].m_backend.exp;
        local_268.neg = vec[iVar3].m_backend.neg;
        local_268.fpclass = vec[iVar3].m_backend.fpclass;
        local_268.prec_elem = vec[iVar3].m_backend.prec_elem;
        local_228.data._M_elems._0_8_ = local_228.data._M_elems._0_8_ & 0xffffffff00000000;
        local_1ec = iVar16;
        local_170 = piVar13;
        tVar12 = boost::multiprecision::operator==
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_268,(int *)&local_228);
        if (tVar12) {
          local_168.data._M_elems[7]._1_3_ = local_1d8.data._M_elems[7]._1_3_;
          local_168.data._M_elems._24_5_ = local_1d8.data._M_elems._24_5_;
          local_168.data._M_elems[0] = local_1d8.data._M_elems[0];
          local_168.data._M_elems[1] = local_1d8.data._M_elems[1];
          uVar6 = local_168.data._M_elems._0_8_;
          local_168.data._M_elems[2] = local_1d8.data._M_elems[2];
          local_168.data._M_elems[3] = local_1d8.data._M_elems[3];
          local_168.data._M_elems[9]._1_3_ = local_1d8.data._M_elems[9]._1_3_;
          local_168.data._M_elems._32_5_ = local_1d8.data._M_elems._32_5_;
          local_168.data._M_elems[4] = local_1d8.data._M_elems[4];
          local_168.data._M_elems[5] = local_1d8.data._M_elems[5];
          local_168.exp = local_1d8.exp;
          local_168.neg = local_1d8.neg;
          local_168.prec_elem = local_1d8.prec_elem;
          local_168.fpclass = local_1d8.fpclass;
          local_168.data._M_elems[0] = local_1d8.data._M_elems[0];
          if (local_1d8.fpclass != cpp_dec_float_finite || local_168.data._M_elems[0] != 0) {
            local_168.neg = (bool)(local_1d8.neg ^ 1);
          }
          local_228.fpclass = cpp_dec_float_finite;
          local_228.prec_elem = 10;
          local_228.data._M_elems[0] = 0;
          local_228.data._M_elems[1] = 0;
          local_228.data._M_elems[2] = 0;
          local_228.data._M_elems[3] = 0;
          local_228.data._M_elems[4] = 0;
          local_228.data._M_elems[5] = 0;
          local_228.data._M_elems._24_5_ = 0;
          local_228.data._M_elems[7]._1_3_ = 0;
          local_228.data._M_elems._32_5_ = 0;
          local_228.data._M_elems[9]._1_3_ = 0;
          local_228.exp = 0;
          local_228.neg = false;
          local_168.data._M_elems._0_8_ = uVar6;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_228,&local_168,v);
          local_128.m_backend.data._M_elems[9]._1_3_ = local_228.data._M_elems[9]._1_3_;
          local_128.m_backend.data._M_elems._32_5_ = local_228.data._M_elems._32_5_;
          local_268.data._M_elems._32_5_ = local_228.data._M_elems._32_5_;
          local_268.data._M_elems[9]._1_3_ = local_228.data._M_elems[9]._1_3_;
          local_128.m_backend.data._M_elems[7]._1_3_ = local_228.data._M_elems[7]._1_3_;
          local_128.m_backend.data._M_elems._24_5_ = local_228.data._M_elems._24_5_;
          local_268.data._M_elems[4] = local_228.data._M_elems[4];
          local_268.data._M_elems[5] = local_228.data._M_elems[5];
          local_268.data._M_elems._24_5_ = local_228.data._M_elems._24_5_;
          local_268.data._M_elems[7]._1_3_ = local_228.data._M_elems[7]._1_3_;
          local_268.data._M_elems[0] = local_228.data._M_elems[0];
          local_268.data._M_elems[1] = local_228.data._M_elems[1];
          local_268.data._M_elems[2] = local_228.data._M_elems[2];
          local_268.data._M_elems[3] = local_228.data._M_elems[3];
          local_268.exp = local_228.exp;
          local_268.neg = local_228.neg;
          local_128.m_backend.fpclass = local_228.fpclass;
          local_128.m_backend.prec_elem = local_228.prec_elem;
          local_268.fpclass = local_228.fpclass;
          local_268.prec_elem = local_228.prec_elem;
          local_128.m_backend.data._M_elems[0] = local_228.data._M_elems[0];
          local_128.m_backend.data._M_elems[1] = local_228.data._M_elems[1];
          local_128.m_backend.data._M_elems[2] = local_228.data._M_elems[2];
          local_128.m_backend.data._M_elems[3] = local_228.data._M_elems[3];
          local_128.m_backend.data._M_elems[4] = local_228.data._M_elems[4];
          local_128.m_backend.data._M_elems[5] = local_228.data._M_elems[5];
          local_128.m_backend.exp = local_228.exp;
          local_128.m_backend.neg = local_228.neg;
          local_a8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((local_1e0->m_backend).data._M_elems + 8);
          local_a8.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(local_1e0->m_backend).data._M_elems;
          local_a8.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((local_1e0->m_backend).data._M_elems + 2);
          local_a8.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((local_1e0->m_backend).data._M_elems + 4);
          local_a8.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((local_1e0->m_backend).data._M_elems + 6);
          local_a8.m_backend.exp = (local_1e0->m_backend).exp;
          local_a8.m_backend.neg = (local_1e0->m_backend).neg;
          local_a8.m_backend.fpclass = (local_1e0->m_backend).fpclass;
          local_a8.m_backend.prec_elem = (local_1e0->m_backend).prec_elem;
          bVar11 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_128,&local_a8);
          if (bVar11) {
            *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
                 CONCAT35(local_268.data._M_elems[9]._1_3_,local_268.data._M_elems._32_5_);
            *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) = local_268.data._M_elems._16_8_;
            *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                 CONCAT35(local_268.data._M_elems[7]._1_3_,local_268.data._M_elems._24_5_);
            *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_268.data._M_elems._0_8_;
            *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_268.data._M_elems._8_8_;
            (pnVar1->m_backend).exp = local_268.exp;
            (pnVar1->m_backend).neg = local_268.neg;
            (pnVar1->m_backend).fpclass = local_268.fpclass;
            (pnVar1->m_backend).prec_elem = local_268.prec_elem;
            enQueueMax(local_270,&local_274,local_1e8[iVar3]);
          }
        }
        else {
          local_228.fpclass = cpp_dec_float_finite;
          local_228.prec_elem = 10;
          local_228.data._M_elems[0] = 0;
          local_228.data._M_elems[1] = 0;
          local_228.data._M_elems[2] = 0;
          local_228.data._M_elems[3] = 0;
          local_228.data._M_elems[4] = 0;
          local_228.data._M_elems[5] = 0;
          local_228.data._M_elems._24_5_ = 0;
          local_228.data._M_elems[7]._1_3_ = 0;
          local_228.data._M_elems._32_5_ = 0;
          local_228.data._M_elems[9]._1_3_ = 0;
          local_228.exp = 0;
          local_228.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_228,&local_1d8,v);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_268,&local_228);
          local_168.data._M_elems._0_8_ = local_168.data._M_elems._0_8_ & 0xffffffff00000000;
          tVar12 = boost::multiprecision::operator!=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_268,(int *)&local_168);
          if (tVar12) {
            local_228.data._M_elems._32_5_ = local_268.data._M_elems._32_5_;
            local_228.data._M_elems[9]._1_3_ = local_268.data._M_elems[9]._1_3_;
            local_228.data._M_elems[4] = local_268.data._M_elems[4];
            local_228.data._M_elems[5] = local_268.data._M_elems[5];
            local_228.data._M_elems._24_5_ = local_268.data._M_elems._24_5_;
            local_228.data._M_elems[7]._1_3_ = local_268.data._M_elems[7]._1_3_;
            local_228.data._M_elems[0] = local_268.data._M_elems[0];
            local_228.data._M_elems[1] = local_268.data._M_elems[1];
            local_228.data._M_elems[2] = local_268.data._M_elems[2];
            local_228.data._M_elems[3] = local_268.data._M_elems[3];
            pcVar7 = &local_268;
            pcVar8 = &local_268;
            pcVar9 = &local_268;
            pcVar10 = &local_268;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&local_228,1e-100,(type *)0x0);
            pcVar7 = &local_228;
            pcVar8 = &local_228;
            pcVar9 = &local_228;
            pcVar10 = &local_228;
          }
          iVar3 = pcVar7->exp;
          bVar11 = pcVar8->neg;
          fVar4 = pcVar9->fpclass;
          iVar5 = pcVar10->prec_elem;
          *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
               CONCAT35(local_228.data._M_elems[9]._1_3_,local_228.data._M_elems._32_5_);
          *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) = local_228.data._M_elems._16_8_;
          *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
               CONCAT35(local_228.data._M_elems[7]._1_3_,local_228.data._M_elems._24_5_);
          *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_228.data._M_elems._0_8_;
          *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_228.data._M_elems._8_8_;
          (pnVar1->m_backend).exp = iVar3;
          (pnVar1->m_backend).neg = bVar11;
          (pnVar1->m_backend).fpclass = fVar4;
          (pnVar1->m_backend).prec_elem = iVar5;
        }
        piVar13 = local_170 + 1;
        v = v + 1;
        iVar16 = local_1ec + -1;
      }
      uVar18 = (ulong)((int)local_180 + 1);
      piVar13 = local_1a0;
      piVar17 = local_178;
      rn = local_274;
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&vec[iVar3].m_backend,0);
      rn = local_274;
    }
  }
  lVar14 = 0;
  uVar15 = 0;
  if (0 < (int)uVar18) {
    uVar15 = uVar18;
  }
  for (; (int)uVar15 != (int)lVar14; lVar14 = lVar14 + 1) {
    local_270[lVar14] = piVar17[lVar14];
  }
  return (int)uVar18;
}

Assistant:

int CLUFactor<R>::solveLleft(R eps, R* vec, int* nonz, int rn)
{
   int i, j, k, n;
   int r;
   R x, y;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig, *rperm;
   int* last;

   ridx  = l.ridx;
   rval  = l.rval.data();
   rbeg  = l.rbeg;
   rorig = l.rorig;
   rperm = l.rperm;
   n     = 0;

   i = l.firstUpdate - 1;
#ifndef SOPLEX_WITH_L_ROWS
#pragma warn "Not yet implemented, define SOPLEX_WITH_L_ROWS"
   R*   lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   for(; i >= 0; --i)
   {
      k   = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x   = 0;

      for(j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   /*  move rhsidx to a heap
    */
   for(i = 0; i < rn;)
      enQueueMax(nonz, &i, rperm[nonz[i]]);

   last = nonz + thedim;

   while(rn > 0)
   {
      i = deQueueMax(nonz, &rn);
      r = rorig[i];
      x = vec[r];

      if(isNotZero(x, eps))
      {
         *(--last) = r;
         n++;
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            int m = *idx++;
            y = vec[m];

            if(y == 0)
            {
               y = -x * *val++;

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  enQueueMax(nonz, &rn, rperm[m]);
               }
            }
            else
            {
               y -= x * *val++;
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
      else
         vec[r] = 0;
   }

   for(i = 0; i < n; ++i)
      *nonz++ = *last++;

#endif

   return n;
}